

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *
initialize_iothub_client
          (IOTHUB_CLIENT_CONFIG *client_config,IOTHUB_CLIENT_DEVICE_CONFIG *device_config,
          _Bool use_dev_auth,char *module_id)

{
  char **ppcVar1;
  char **ppcVar2;
  IOTHUB_CREDENTIAL_TYPE IVar3;
  int iVar4;
  IOTHUB_CLIENT_RESULT IVar5;
  time_t tVar6;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  IOTHUB_AUTHORIZATION_HANDLE pIVar7;
  LOGGER_LOG p_Var8;
  TRANSPORT_PROVIDER *pTVar9;
  TRANSPORT_LL_HANDLE pvVar10;
  char *pcVar11;
  size_t sVar12;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE pIVar13;
  TICK_COUNTER_HANDLE pTVar14;
  STRING_HANDLE pSVar15;
  IOTHUB_DEVICE_HANDLE pvVar16;
  char **ppcVar17;
  char *pcVar18;
  char *pcVar19;
  PLATFORM_INFO_OPTION supportedPlatformInfo;
  char *x509_certificate;
  char *local_e8;
  STRING_HANDLE local_e0;
  char *local_d8;
  size_t local_d0;
  char *local_c8;
  char *local_c0;
  TRANSPORT_CALLBACKS_INFO local_b8;
  IOTHUB_CLIENT_CONFIG local_68;
  
  tVar6 = get_time((time_t *)0x0);
  srand((uint)tVar6);
  handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)calloc(1,0x1d0);
  if (handleData == (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
    }
    (*p_Var8)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"initialize_iothub_client",0x382,1,
              "failure allocating IOTHUB_CLIENT_CORE_LL_HANDLE_DATA");
    return (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
  }
  if (use_dev_auth) {
    pIVar7 = IoTHubClient_Auth_CreateFromDeviceAuth(client_config->deviceId,module_id);
    handleData->authorization_module = pIVar7;
    if (pIVar7 != (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
LAB_0011ed10:
      local_b8.send_complete_cb = IoTHubClientCore_LL_SendComplete;
      local_b8.twin_retrieve_prop_complete_cb = IoTHubClientCore_LL_RetrievePropertyComplete;
      local_b8.twin_rpt_state_complete_cb = IoTHubClientCore_LL_ReportedStateComplete;
      local_b8.connection_status_cb = IoTHubClientCore_LL_ConnectionStatusCallBack;
      local_b8.prod_info_cb = IoTHubClientCore_LL_GetProductInfo;
      local_b8.msg_input_cb = IoTHubClientCore_LL_MessageCallbackFromInput;
      local_b8.msg_cb = IoTHubClientCore_LL_MessageCallback;
      local_b8.method_complete_cb = IoTHubClientCore_LL_DeviceMethodComplete;
      local_b8.get_model_id_cb = IoTHubClientCore_LL_GetModelId;
      if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) {
        if (device_config != (IOTHUB_CLIENT_DEVICE_CONFIG *)0x0) {
          handleData->transportHandle = device_config->transportHandle;
          pTVar9 = (*device_config->protocol)();
          setTransportProtocol(handleData,pTVar9);
          iVar4 = (*handleData->IoTHubTransport_SetCallbackContext)
                            (handleData->transportHandle,handleData);
          if (iVar4 == 0) {
            pSVar15 = (*handleData->IoTHubTransport_GetHostname)(handleData->transportHandle);
            if (pSVar15 == (STRING_HANDLE)0x0) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar18 = "unable to determine the transport IoTHub name";
                iVar4 = 999;
                goto LAB_0011ee2e;
              }
              goto LAB_0011ee39;
            }
            local_e0 = pSVar15;
            pcVar18 = STRING_c_str(pSVar15);
            pcVar11 = strchr(pcVar18,0x2e);
            if (pcVar11 == (char *)0x0) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar18 = "unable to determine the IoTHub name";
                iVar4 = 0x3f3;
LAB_0011f0ca:
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                          ,"initialize_iothub_client",iVar4,1,pcVar18);
              }
LAB_0011f0d5:
              IoTHubClient_Auth_Destroy(handleData->authorization_module);
              free(handleData);
              pcVar18 = (char *)0x0;
LAB_0011f0ef:
              pcVar11 = (char *)0x0;
              client_config = (IOTHUB_CLIENT_CONFIG *)0x0;
              handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
              pSVar15 = local_e0;
            }
            else {
              pcVar19 = pcVar11 + (1 - (long)pcVar18);
              if (pcVar19 == (char *)0x0) {
                pcVar19 = (char *)0xffffffffffffffff;
              }
              local_d0 = (long)pcVar11 - (long)pcVar18;
              if (pcVar11 < pcVar18) {
                pcVar19 = (char *)0xffffffffffffffff;
              }
              local_c8 = pcVar18;
              local_c0 = pcVar11;
              sVar12 = strlen(pcVar11);
              sVar12 = sVar12 + 1;
              if (sVar12 == 0) {
                sVar12 = 0xffffffffffffffff;
              }
              if ((pcVar19 == (char *)0xffffffffffffffff) ||
                 (local_d8 = (char *)calloc(1,(size_t)pcVar19), local_d8 == (char *)0x0)) {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  pcVar18 = "unable to calloc, size:%zu";
                  iVar4 = 0x400;
                  goto LAB_0011f0ca;
                }
                goto LAB_0011f0d5;
              }
              if ((sVar12 == 0xffffffffffffffff) ||
                 (pcVar11 = (char *)malloc(sVar12), pcVar11 == (char *)0x0)) {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"initialize_iothub_client",0x408,1,"unable to malloc");
                }
                IoTHubClient_Auth_Destroy(handleData->authorization_module);
                pcVar18 = local_d8;
                free(local_d8);
                free(handleData);
                goto LAB_0011f0ef;
              }
              memcpy(local_d8,local_c8,local_d0);
              strcpy(pcVar11,local_c0 + 1);
              local_68.deviceId = device_config->deviceId;
              local_68.deviceKey = device_config->deviceKey;
              client_config = &local_68;
              local_68.deviceSasToken = device_config->deviceSasToken;
              local_68.iotHubName = local_d8;
              local_68.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
              local_68.protocolGatewayHostName = (char *)0x0;
              handleData->isSharedTransport = true;
              pSVar15 = local_e0;
              pcVar18 = local_d8;
              local_68.iotHubSuffix = pcVar11;
            }
          }
          else {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar18 = "unable to set transport callbacks";
              iVar4 = 0x3e0;
LAB_0011ee2e:
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"initialize_iothub_client",iVar4,1,pcVar18);
            }
LAB_0011ee39:
            IoTHubClient_Auth_Destroy(handleData->authorization_module);
            free(handleData);
            pcVar11 = (char *)0x0;
            client_config = (IOTHUB_CLIENT_CONFIG *)0x0;
            handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
            pSVar15 = (STRING_HANDLE)0x0;
            pcVar18 = (char *)0x0;
          }
          STRING_delete(pSVar15);
          goto LAB_0011f0fe;
        }
        client_config = (IOTHUB_CLIENT_CONFIG *)0x0;
        pcVar18 = (char *)0x0;
        pcVar11 = (char *)0x0;
LAB_0011f107:
        pIVar13 = IoTHubClient_LL_UploadToBlob_Create
                            (client_config,handleData->authorization_module);
        handleData->uploadToBlobHandle = pIVar13;
        if (pIVar13 == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar19 = "unable to IoTHubClientCore_LL_UploadToBlob_Create";
            iVar4 = 0x18d;
LAB_0011f1c1:
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"create_blob_upload_module",iVar4,1,pcVar19);
          }
LAB_0011f280:
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar19 = "unable to create blob upload";
            iVar4 = 0x428;
LAB_0011f2a9:
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"initialize_iothub_client",iVar4,1,pcVar19);
          }
LAB_0011f2b4:
          if (handleData->isSharedTransport == false) {
            (*handleData->IoTHubTransport_Destroy)(handleData->transportHandle);
          }
LAB_0011f35d:
          IoTHubClient_LL_UploadToBlob_Destroy(handleData->uploadToBlobHandle);
          IoTHubClient_Auth_Destroy(handleData->authorization_module);
        }
        else {
          IVar3 = IoTHubClient_Auth_Get_Credential_Type(handleData->authorization_module);
          if ((use_dev_auth) &&
             ((IVar3 & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) == IOTHUB_CREDENTIAL_TYPE_X509)) {
            local_b8.msg_input_cb = (pfTransport_MessageCallbackFromInput)0x0;
            local_e8 = (char *)0x0;
            iVar4 = IoTHubClient_Auth_Get_x509_info
                              (handleData->authorization_module,(char **)&local_b8,&local_e8);
            if (iVar4 == 0) {
              IVar5 = IoTHubClient_LL_UploadToBlob_SetOption
                                (handleData->uploadToBlobHandle,"x509certificate",
                                 local_b8.msg_input_cb);
              if (IVar5 == IOTHUB_CLIENT_OK) {
                IVar5 = IoTHubClient_LL_UploadToBlob_SetOption
                                  (handleData->uploadToBlobHandle,"x509privatekey",local_e8);
                if (IVar5 == IOTHUB_CLIENT_OK) {
                  free(local_b8.msg_input_cb);
                  free(local_e8);
                  goto LAB_0011f2e1;
                }
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  pcVar19 = "Failed setting x509 client private key for upload to blob.";
                  iVar4 = 0x1a8;
                  goto LAB_0011f261;
                }
              }
              else {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  pcVar19 = "Failed setting x509 client certificate for upload to blob.";
                  iVar4 = 0x1a3;
LAB_0011f261:
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"create_blob_upload_module",iVar4,1,pcVar19);
                }
              }
              free(local_b8.msg_input_cb);
              free(local_e8);
            }
            else {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar19 = 
                "Failed retrieving x509 client certificate and/or private key for upload to blob.";
                iVar4 = 0x19c;
                goto LAB_0011f1c1;
              }
            }
            goto LAB_0011f280;
          }
LAB_0011f2e1:
          pTVar14 = tickcounter_create();
          handleData->tickCounter = pTVar14;
          if (pTVar14 == (TICK_COUNTER_HANDLE)0x0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar19 = "unable to get a tickcounter";
              iVar4 = 0x443;
              goto LAB_0011f2a9;
            }
            goto LAB_0011f2b4;
          }
          iVar4 = (*handleData->IoTHubTransport_GetSupportedPlatformInfo)
                            (handleData->transportHandle,(PLATFORM_INFO_OPTION *)&local_e8);
          if (iVar4 != 0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar19 = "failed to get supported platform info";
              iVar4 = 0x451;
LAB_0011f336:
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"initialize_iothub_client",iVar4,1,pcVar19);
            }
LAB_0011f341:
            if (handleData->isSharedTransport == false) {
              (*handleData->IoTHubTransport_Destroy)(handleData->transportHandle);
            }
            tickcounter_destroy(handleData->tickCounter);
            goto LAB_0011f35d;
          }
          pSVar15 = make_product_info((char *)0x0,(PLATFORM_INFO_OPTION)local_e8);
          handleData->product_info = pSVar15;
          if (pSVar15 == (STRING_HANDLE)0x0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar19 = "failed to initialize product info";
              iVar4 = 0x45f;
              goto LAB_0011f336;
            }
            goto LAB_0011f341;
          }
          if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) goto LAB_0011f37f;
          DList_InitializeListHead(&handleData->waitingToSend);
          DList_InitializeListHead(&handleData->iot_msg_queue);
          DList_InitializeListHead(&handleData->iot_ack_queue);
          (handleData->messageCallback).type = CALLBACK_TYPE_NONE;
          (handleData->methodCallback).type = CALLBACK_TYPE_NONE;
          handleData->lastMessageReceiveTime = -1;
          handleData->data_msg_id = 1;
          local_b8.msg_input_cb = (pfTransport_MessageCallbackFromInput)client_config->deviceId;
          local_b8.msg_cb = (pfTransport_MessageCallback)client_config->deviceKey;
          local_b8.connection_status_cb =
               (pfTransport_ConnectionStatusCallBack)client_config->deviceSasToken;
          local_b8.send_complete_cb =
               (pfTransport_SendComplete_Callback)handleData->authorization_module;
          local_b8.prod_info_cb = (pfTransport_GetOption_Product_Info_Callback)module_id;
          pvVar16 = (*handleData->IoTHubTransport_Register)
                              (handleData->transportHandle,(IOTHUB_DEVICE_CONFIG *)&local_b8,
                               &handleData->waitingToSend);
          handleData->deviceHandle = pvVar16;
          if (pvVar16 == (IOTHUB_DEVICE_HANDLE)0x0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"initialize_iothub_client",0x47e,1,"Registering device in transport failed"
                       );
            }
          }
          else {
            (handleData->diagnostic_setting).diagSamplingPercentage = 0;
            (handleData->diagnostic_setting).currentMessageNumber = 0;
            handleData->currentMessageTimeout = 0;
            handleData->current_device_twin_timeout = 0;
            IVar5 = IoTHubClientCore_LL_SetRetryPolicy
                              (handleData,IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER,0);
            if (IVar5 == IOTHUB_CLIENT_OK) goto LAB_0011f37f;
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"initialize_iothub_client",0x494,1,
                        "Setting default retry policy in transport failed");
            }
            (*handleData->IoTHubTransport_Unregister)(handleData->deviceHandle);
          }
          IoTHubClient_Auth_Destroy(handleData->authorization_module);
          if (handleData->isSharedTransport == false) {
            (*handleData->IoTHubTransport_Destroy)(handleData->transportHandle);
          }
          IoTHubClient_LL_UploadToBlob_Destroy(handleData->uploadToBlobHandle);
          tickcounter_destroy(handleData->tickCounter);
          STRING_delete(handleData->product_info);
        }
        free(handleData);
      }
      else {
        local_68.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)client_config;
        local_68.deviceId = (char *)handleData;
        local_68.deviceKey = (char *)pIVar7;
        local_68.deviceSasToken = module_id;
        pTVar9 = (*client_config->protocol)();
        setTransportProtocol(handleData,pTVar9);
        pvVar10 = (*handleData->IoTHubTransport_Create)
                            ((IOTHUBTRANSPORT_CONFIG *)&local_68,&local_b8,handleData);
        handleData->transportHandle = pvVar10;
        if (pvVar10 == (TRANSPORT_LL_HANDLE)0x0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"initialize_iothub_client",0x3c9,1,"underlying transport failed");
          }
          IoTHubClient_LL_UploadToBlob_Destroy(handleData->uploadToBlobHandle);
          tickcounter_destroy(handleData->tickCounter);
          IoTHubClient_Auth_Destroy(handleData->authorization_module);
          free(handleData);
          client_config = (IOTHUB_CLIENT_CONFIG *)0x0;
          handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
        }
        else {
          handleData->isSharedTransport = false;
        }
        pcVar11 = (char *)0x0;
        pcVar18 = (char *)0x0;
LAB_0011f0fe:
        if (handleData != (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) goto LAB_0011f107;
      }
      handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
LAB_0011f37f:
      if (pcVar18 != (char *)0x0) {
        free(pcVar18);
      }
      if (pcVar11 != (char *)0x0) {
        free(pcVar11);
        return handleData;
      }
      return handleData;
    }
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0011ee93;
    iVar4 = 0x390;
  }
  else {
    ppcVar17 = &device_config->deviceKey;
    ppcVar1 = &device_config->deviceSasToken;
    ppcVar2 = &device_config->deviceId;
    if (device_config == (IOTHUB_CLIENT_DEVICE_CONFIG *)0x0) {
      ppcVar17 = &client_config->deviceKey;
      ppcVar1 = &client_config->deviceSasToken;
      ppcVar2 = &client_config->deviceId;
    }
    pIVar7 = IoTHubClient_Auth_Create(*ppcVar17,*ppcVar2,*ppcVar1,module_id);
    handleData->authorization_module = pIVar7;
    if (pIVar7 != (IOTHUB_AUTHORIZATION_HANDLE)0x0) goto LAB_0011ed10;
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0011ee93;
    iVar4 = 0x3a9;
  }
  (*p_Var8)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"initialize_iothub_client",iVar4,1,"Failed create authorization module");
LAB_0011ee93:
  free(handleData);
  return (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
}

Assistant:

static IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* initialize_iothub_client(const IOTHUB_CLIENT_CONFIG* client_config, const IOTHUB_CLIENT_DEVICE_CONFIG* device_config, bool use_dev_auth, const char* module_id)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* result;
    srand((unsigned int)get_time(NULL));

    result = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)malloc(sizeof(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA));
    if (result == NULL)
    {
        LogError("failure allocating IOTHUB_CLIENT_CORE_LL_HANDLE_DATA");
    }
    else
    {
        IOTHUB_CLIENT_CONFIG actual_config;
        const IOTHUB_CLIENT_CONFIG* config = NULL;
        char* IoTHubName = NULL;
        char* IoTHubSuffix = NULL;

        memset(result, 0, sizeof(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA));
        if (use_dev_auth)
        {
            if ((result->authorization_module = IoTHubClient_Auth_CreateFromDeviceAuth(client_config->deviceId, module_id)) == NULL)
            {
                LogError("Failed create authorization module");
                free(result);
                result = NULL;
            }
        }
        else
        {
            const char* device_key;
            const char* device_id;
            const char* sas_token;
            if (device_config == NULL)
            {
                device_key = client_config->deviceKey;
                device_id = client_config->deviceId;
                sas_token = client_config->deviceSasToken;
            }
            else
            {
                device_key = device_config->deviceKey;
                device_id = device_config->deviceId;
                sas_token = device_config->deviceSasToken;
            }

            if ((result->authorization_module = IoTHubClient_Auth_Create(device_key, device_id, sas_token, module_id)) == NULL)
            {
                LogError("Failed create authorization module");
                free(result);
                result = NULL;
            }
        }

        if (result != NULL)
        {
            TRANSPORT_CALLBACKS_INFO transport_cb;
            memset(&transport_cb, 0, sizeof(TRANSPORT_CALLBACKS_INFO));
            transport_cb.send_complete_cb = IoTHubClientCore_LL_SendComplete;
            transport_cb.twin_retrieve_prop_complete_cb = IoTHubClientCore_LL_RetrievePropertyComplete;
            transport_cb.twin_rpt_state_complete_cb = IoTHubClientCore_LL_ReportedStateComplete;
            transport_cb.connection_status_cb = IoTHubClientCore_LL_ConnectionStatusCallBack;
            transport_cb.prod_info_cb = IoTHubClientCore_LL_GetProductInfo;
            transport_cb.msg_input_cb = IoTHubClientCore_LL_MessageCallbackFromInput;
            transport_cb.msg_cb = IoTHubClientCore_LL_MessageCallback;
            transport_cb.method_complete_cb = IoTHubClientCore_LL_DeviceMethodComplete;
            transport_cb.get_model_id_cb = IoTHubClientCore_LL_GetModelId;

            if (client_config != NULL)
            {
                IOTHUBTRANSPORT_CONFIG lowerLayerConfig;
                memset(&lowerLayerConfig, 0, sizeof(IOTHUBTRANSPORT_CONFIG));
                lowerLayerConfig.upperConfig = client_config;
                lowerLayerConfig.waitingToSend = &(result->waitingToSend);
                lowerLayerConfig.auth_module_handle = result->authorization_module;
                lowerLayerConfig.moduleId = module_id;

                setTransportProtocol(result, (TRANSPORT_PROVIDER*)client_config->protocol());
                if ((result->transportHandle = result->IoTHubTransport_Create(&lowerLayerConfig, &transport_cb, result)) == NULL)
                {
                    LogError("underlying transport failed");
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    tickcounter_destroy(result->tickCounter);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else
                {
                    result->isSharedTransport = false;
                    config = client_config;
                }
            }
            else if (device_config != NULL)
            {
                STRING_HANDLE transport_hostname = NULL;

                result->transportHandle = device_config->transportHandle;
                setTransportProtocol(result, (TRANSPORT_PROVIDER*)device_config->protocol());

                if (result->IoTHubTransport_SetCallbackContext(result->transportHandle, result) != 0)
                {
                    LogError("unable to set transport callbacks");
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else if ((transport_hostname = result->IoTHubTransport_GetHostname(result->transportHandle)) == NULL)
                {
                    LogError("unable to determine the transport IoTHub name");
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else
                {
                    const char* hostname = STRING_c_str(transport_hostname);
                    /*the first '.' says where the iothubname finishes*/
                    const char* whereIsDot = strchr(hostname, '.');
                    if (whereIsDot == NULL)
                    {
                        LogError("unable to determine the IoTHub name");
                        IoTHubClient_Auth_Destroy(result->authorization_module);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t suffix_len = strlen(whereIsDot);
                        size_t calloc_size_hub_name = safe_add_size_t(safe_subtract_size_t(whereIsDot, hostname), 1);
                        size_t malloc_size_hub_suffix = safe_add_size_t(suffix_len, 1);
                        if (calloc_size_hub_name == SIZE_MAX ||
                            (IoTHubName = (char*)calloc(1, calloc_size_hub_name)) == NULL)
                        {
                            LogError("unable to calloc, size:%zu", calloc_size_hub_name);
                            IoTHubClient_Auth_Destroy(result->authorization_module);
                            free(result);
                            result = NULL;
                        }
                        else if (malloc_size_hub_suffix == SIZE_MAX ||
                            (IoTHubSuffix = (char*)malloc(malloc_size_hub_suffix)) == NULL)
                        {
                            LogError("unable to malloc");
                            IoTHubClient_Auth_Destroy(result->authorization_module);
                            free(IoTHubName);
                            free(result);
                            result = NULL;
                        }
                        else
                        {
                            (void)memcpy(IoTHubName, hostname, whereIsDot - hostname);
                            (void)strcpy(IoTHubSuffix, whereIsDot+1);

                            actual_config.deviceId = device_config->deviceId;
                            actual_config.deviceKey = device_config->deviceKey;
                            actual_config.deviceSasToken = device_config->deviceSasToken;
                            actual_config.iotHubName = IoTHubName;
                            actual_config.iotHubSuffix = IoTHubSuffix;
                            actual_config.protocol = NULL; /*irrelevant to IoTHubClientCore_LL_UploadToBlob*/
                            actual_config.protocolGatewayHostName = NULL; /*irrelevant to IoTHubClientCore_LL_UploadToBlob*/

                            config = &actual_config;

                            result->isSharedTransport = true;
                        }
                    }
                }
                STRING_delete(transport_hostname);
            }
        }
        if (result != NULL)
        {
            if (create_blob_upload_module(result, config, use_dev_auth) != 0)
            {
                LogError("unable to create blob upload");
                if (!result->isSharedTransport)
                {
                    result->IoTHubTransport_Destroy(result->transportHandle);
                }
                destroy_blob_upload_module(result);
                IoTHubClient_Auth_Destroy(result->authorization_module);
                free(result);
                result = NULL;
            }
            else if ((module_id != NULL) && create_edge_handle(result, config, module_id) != 0)
            {
                LogError("unable to create module method handle");
                if (!result->isSharedTransport)
                {
                    result->IoTHubTransport_Destroy(result->transportHandle);
                }
                destroy_blob_upload_module(result);
                IoTHubClient_Auth_Destroy(result->authorization_module);
                free(result);
                result = NULL;
            }
            else
            {
                PLATFORM_INFO_OPTION supportedPlatformInfo;
                if ((result->tickCounter = tickcounter_create()) == NULL)
                {
                    LogError("unable to get a tickcounter");
                    if (!result->isSharedTransport)
                    {
                        result->IoTHubTransport_Destroy(result->transportHandle);
                    }
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                // Add extended info to product info if required
                else if (result->IoTHubTransport_GetSupportedPlatformInfo(result->transportHandle, &supportedPlatformInfo) != 0)
                {
                    LogError("failed to get supported platform info");
                    if (!result->isSharedTransport)
                    {
                        result->IoTHubTransport_Destroy(result->transportHandle);
                    }
                    tickcounter_destroy(result->tickCounter);
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else if ((result->product_info = make_product_info(NULL, supportedPlatformInfo)) == NULL)
                {
                    LogError("failed to initialize product info");
                    if (!result->isSharedTransport)
                    {
                        result->IoTHubTransport_Destroy(result->transportHandle);
                    }
                    tickcounter_destroy(result->tickCounter);
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else if (config != NULL)
                {
                    DList_InitializeListHead(&(result->waitingToSend));
                    DList_InitializeListHead(&(result->iot_msg_queue));
                    DList_InitializeListHead(&(result->iot_ack_queue));
                    result->messageCallback.type = CALLBACK_TYPE_NONE;
                    result->methodCallback.type = CALLBACK_TYPE_NONE;
                    result->lastMessageReceiveTime = INDEFINITE_TIME;
                    result->data_msg_id = 1;

                    IOTHUB_DEVICE_CONFIG deviceConfig;
                    deviceConfig.deviceId = config->deviceId;
                    deviceConfig.deviceKey = config->deviceKey;
                    deviceConfig.deviceSasToken = config->deviceSasToken;
                    deviceConfig.authorization_module = result->authorization_module;
                    deviceConfig.moduleId = module_id;

                    if ((result->deviceHandle = result->IoTHubTransport_Register(result->transportHandle, &deviceConfig, &(result->waitingToSend))) == NULL)
                    {
                        LogError("Registering device in transport failed");
                        IoTHubClient_Auth_Destroy(result->authorization_module);
                        if (!result->isSharedTransport)
                        {
                            result->IoTHubTransport_Destroy(result->transportHandle);
                        }
                        destroy_blob_upload_module(result);
                        destroy_module_method_module(result);
                        tickcounter_destroy(result->tickCounter);
                        STRING_delete(result->product_info);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        result->currentMessageTimeout = 0;
                        result->current_device_twin_timeout = 0;

                        result->diagnostic_setting.currentMessageNumber = 0;
                        result->diagnostic_setting.diagSamplingPercentage = 0;
                        if (IoTHubClientCore_LL_SetRetryPolicy(result, IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER, 0) != IOTHUB_CLIENT_OK)
                        {
                            LogError("Setting default retry policy in transport failed");
                            result->IoTHubTransport_Unregister(result->deviceHandle);
                            IoTHubClient_Auth_Destroy(result->authorization_module);
                            if (!result->isSharedTransport)
                            {
                                result->IoTHubTransport_Destroy(result->transportHandle);
                            }
                            destroy_blob_upload_module(result);
                            destroy_module_method_module(result);
                            tickcounter_destroy(result->tickCounter);
                            STRING_delete(result->product_info);
                            free(result);
                            result = NULL;
                        }
                    }
                }
            }
        }
        if (IoTHubName)
        {
            free(IoTHubName);
        }
        if (IoTHubSuffix)
        {
            free(IoTHubSuffix);
        }
    }
    return result;
}